

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrImpl.cpp
# Opt level: O0

XMLCh * __thiscall xercesc_4_0::DOMAttrImpl::getValue(DOMAttrImpl *this)

{
  DOMDocument *pDVar1;
  XMLCh *this_00;
  int iVar2;
  DOMChildNode *pDVar3;
  undefined4 extraout_var;
  MemoryManager *manager;
  XMLCh *in;
  DOMDocumentImpl *local_88;
  undefined1 local_60 [8];
  XMLBuffer buf;
  DOMDocumentImpl *doc;
  DOMNode *node;
  DOMAttrImpl *this_local;
  
  if ((this->fParent).fFirstChild == (DOMNode *)0x0) {
    this_local = (DOMAttrImpl *)&XMLUni::fgZeroLenString;
  }
  else {
    pDVar3 = castToChildImpl((this->fParent).fFirstChild);
    if ((pDVar3->nextSibling == (DOMNode *)0x0) &&
       (iVar2 = (*((this->fParent).fFirstChild)->_vptr_DOMNode[4])(), iVar2 == 3)) {
      iVar2 = (*((this->fParent).fFirstChild)->_vptr_DOMNode[3])();
      return (XMLCh *)CONCAT44(extraout_var,iVar2);
    }
    pDVar1 = (this->fParent).fOwnerDocument;
    if (pDVar1 == (DOMDocument *)0x0) {
      local_88 = (DOMDocumentImpl *)0x0;
    }
    else {
      local_88 = (DOMDocumentImpl *)&pDVar1[-1].super_DOMNode;
    }
    buf.fBuffer = (XMLCh *)local_88;
    manager = DOMDocumentImpl::getMemoryManager(local_88);
    XMLBuffer::XMLBuffer((XMLBuffer *)local_60,0x3ff,manager);
    doc = (DOMDocumentImpl *)(this->fParent).fFirstChild;
    while (this_00 = buf.fBuffer, doc != (DOMDocumentImpl *)0x0) {
      getTextValue(this,(DOMNode *)doc,(XMLBuffer *)local_60);
      pDVar3 = castToChildImpl((DOMNode *)doc);
      doc = (DOMDocumentImpl *)pDVar3->nextSibling;
    }
    in = XMLBuffer::getRawBuffer((XMLBuffer *)local_60);
    this_local = (DOMAttrImpl *)DOMDocumentImpl::getPooledString((DOMDocumentImpl *)this_00,in);
    XMLBuffer::~XMLBuffer((XMLBuffer *)local_60);
  }
  return (XMLCh *)this_local;
}

Assistant:

const XMLCh * DOMAttrImpl::getValue() const
{
    if (fParent.fFirstChild == 0) {
        return XMLUni::fgZeroLenString; // return "";
    }

    // Simple case where attribute value is just a single text node
    DOMNode *node = castToChildImpl(fParent.fFirstChild)->nextSibling;
    if (node == 0 && fParent.fFirstChild->getNodeType() == DOMNode::TEXT_NODE) {
        return fParent.fFirstChild->getNodeValue();
    }

    //
    // Complicated case where attribute value is a DOM tree
    //
    // According to the spec, the child nodes of the Attr node may be either
    // Text or EntityReference nodes.
    //
    // The parser will not create such thing, this is for those created by users.
    //
    // In such case, we have to visit each child to retrieve the text
    //

    DOMDocumentImpl* doc = (DOMDocumentImpl*)fParent.fOwnerDocument;

    XMLBuffer buf(1023, doc->getMemoryManager());
    for (node = fParent.fFirstChild; node != 0; node = castToChildImpl(node)->nextSibling)
        getTextValue(node, buf);

    return doc->getPooledString(buf.getRawBuffer());
}